

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::internal::GeneratedMessageReflection::FindKnownExtensionByName
          (GeneratedMessageReflection *this,string *name)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  Descriptor *pDVar4;
  MessageOptions *this_00;
  FieldDescriptor *this_01;
  Descriptor *pDVar5;
  FieldDescriptor *extension;
  int i;
  Descriptor *type;
  FieldDescriptor *result;
  string *name_local;
  GeneratedMessageReflection *this_local;
  
  if (this->extensions_offset_ == -1) {
    this_local = (GeneratedMessageReflection *)0x0;
  }
  else {
    this_local = (GeneratedMessageReflection *)
                 DescriptorPool::FindExtensionByName(this->descriptor_pool_,name);
    if ((this_local == (GeneratedMessageReflection *)0x0) ||
       (pDVar4 = FieldDescriptor::containing_type((FieldDescriptor *)this_local),
       pDVar4 != this->descriptor_)) {
      this_00 = Descriptor::options(this->descriptor_);
      bVar1 = MessageOptions::message_set_wire_format(this_00);
      if ((bVar1) &&
         (pDVar4 = DescriptorPool::FindMessageTypeByName(this->descriptor_pool_,name),
         pDVar4 != (Descriptor *)0x0)) {
        for (extension._4_4_ = 0; iVar2 = Descriptor::extension_count(pDVar4),
            extension._4_4_ < iVar2; extension._4_4_ = extension._4_4_ + 1) {
          this_01 = Descriptor::extension(pDVar4,extension._4_4_);
          pDVar5 = FieldDescriptor::containing_type(this_01);
          if ((((pDVar5 == this->descriptor_) &&
               (TVar3 = FieldDescriptor::type(this_01), TVar3 == TYPE_MESSAGE)) &&
              (bVar1 = FieldDescriptor::is_optional(this_01), bVar1)) &&
             (pDVar5 = FieldDescriptor::message_type(this_01), pDVar5 == pDVar4)) {
            return this_01;
          }
        }
      }
      this_local = (GeneratedMessageReflection *)0x0;
    }
  }
  return (FieldDescriptor *)this_local;
}

Assistant:

const FieldDescriptor* GeneratedMessageReflection::FindKnownExtensionByName(
    const string& name) const {
  if (extensions_offset_ == -1) return NULL;

  const FieldDescriptor* result = descriptor_pool_->FindExtensionByName(name);
  if (result != NULL && result->containing_type() == descriptor_) {
    return result;
  }

  if (descriptor_->options().message_set_wire_format()) {
    // MessageSet extensions may be identified by type name.
    const Descriptor* type = descriptor_pool_->FindMessageTypeByName(name);
    if (type != NULL) {
      // Look for a matching extension in the foreign type's scope.
      for (int i = 0; i < type->extension_count(); i++) {
        const FieldDescriptor* extension = type->extension(i);
        if (extension->containing_type() == descriptor_ &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() &&
            extension->message_type() == type) {
          // Found it.
          return extension;
        }
      }
    }
  }

  return NULL;
}